

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O3

void iutest::detail::PrintBytesInObjectTo(uchar *buf,size_t size,iu_ostream *os)

{
  byte bVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  char cVar3;
  size_t i;
  size_t sVar4;
  byte bVar5;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"-Byte object < ",0xf);
  if (size != 0 && buf != (uchar *)0x0) {
    sVar4 = 0;
    do {
      if (sVar4 == 0x20) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"... ",4);
        break;
      }
      bVar5 = buf[sVar4];
      bVar1 = bVar5 >> 4 | 0x30;
      if (0x9f < bVar5) {
        bVar1 = (bVar5 >> 4) + 0x37;
      }
      uStack_38._0_7_ = CONCAT16(bVar1,(undefined6)uStack_38);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(char *)((long)&uStack_38 + 6),1);
      bVar5 = bVar5 & 0xf;
      cVar3 = bVar5 + 0x30;
      if (9 < bVar5) {
        cVar3 = bVar5 + 0x37;
      }
      uStack_38 = CONCAT17(cVar3,(undefined7)uStack_38);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)((long)&uStack_38 + 7),1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      sVar4 = sVar4 + 1;
    } while (size != sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,">",1);
  return;
}

Assistant:

inline void PrintBytesInObjectTo(const unsigned char* buf, size_t size, iu_ostream* os)
{
IUTEST_PRAGMA_CONSTEXPR_CALLED_AT_RUNTIME_WARN_DISABLE_BEGIN()
    const size_t kMaxCount = detail::kValues::MaxPrintContainerCount;
    *os << size << "-Byte object < ";
    if( buf != IUTEST_NULLPTR && size > 0 )
    {
        for( size_t i=0; i < size; ++i )
        {
            if( i == kMaxCount )
            {
                *os << "... ";
                break;
            }
#ifdef __clang_analyzer__
            const unsigned char n = 0;  // suppress
#else
            const unsigned char n = buf[i];
#endif
            *os << ToHex((n>>4)&0xF) << ToHex(n&0xF) << " ";
        }
    }
    *os << ">";
IUTEST_PRAGMA_CONSTEXPR_CALLED_AT_RUNTIME_WARN_DISABLE_END()
}